

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alias.cpp
# Opt level: O2

void duckdb::AliasFunction(DataChunk *args,ExpressionState *state,Vector *result)

{
  BoundFunctionExpression *pBVar1;
  const_reference this;
  pointer pEVar2;
  Value v;
  string local_70 [32];
  Value local_50 [64];
  
  pBVar1 = BaseExpression::Cast<duckdb::BoundFunctionExpression>(*(BaseExpression **)(state + 8));
  if (*(long *)(*(long *)(state + 8) + 0x18) == 0) {
    this = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::get<true>((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                        *)(pBVar1 + 0x180),0);
    pEVar2 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(this);
    (**(code **)(*(long *)pEVar2 + 0x38))(local_70,pEVar2);
  }
  else {
    std::__cxx11::string::string(local_70,(string *)(*(long *)(state + 8) + 0x10));
  }
  duckdb::Value::Value(local_50,local_70);
  std::__cxx11::string::~string(local_70);
  duckdb::Vector::Reference((Value *)result);
  duckdb::Value::~Value(local_50);
  return;
}

Assistant:

static void AliasFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	auto &func_expr = state.expr.Cast<BoundFunctionExpression>();
	Value v(state.expr.GetAlias().empty() ? func_expr.children[0]->GetName() : state.expr.GetAlias());
	result.Reference(v);
}